

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sexp_conflict
sexp_get_opcode_name(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op)

{
  sexp_conflict psVar1;
  sexp_conflict psVar2;
  
  if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
    psVar2 = (op->value).type.name;
    psVar1 = (sexp_conflict)0x3e;
    if (psVar2 != (sexp_conflict)0x0) {
      psVar1 = psVar2;
    }
    return psVar1;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x1b);
  return psVar2;
}

Assistant:

sexp sexp_get_opcode_name (sexp ctx, sexp self, sexp_sint_t n, sexp op) {
  if (! sexp_opcodep(op))
    return sexp_type_exception(ctx, self, SEXP_OPCODE, op);
  else if (! sexp_opcode_name(op))
    return SEXP_FALSE;
  else
    return sexp_opcode_name(op);
}